

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
SBarInfoMainBlock::Parse(SBarInfoMainBlock *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  
  this->fullScreenOffsets = fullScreenOffsets;
  bVar1 = FScanner::CheckToken(sc,0x2c);
  if (bVar1) {
    do {
      bVar1 = FScanner::CheckToken(sc,0x101);
      if (!bVar1) {
        FScanner::MustGetToken(sc,0x106);
        this->alpha = sc->Float;
        break;
      }
      bVar1 = FScanner::Compare(sc,"forcescaled");
      if (bVar1) {
        this->forceScaled = true;
      }
      else {
        bVar1 = FScanner::Compare(sc,"fullscreenoffsets");
        if (bVar1) {
          this->fullScreenOffsets = true;
        }
        else {
          FScanner::ScriptError(sc,"Unkown flag \'%s\'.",sc->String);
        }
      }
      bVar1 = FScanner::CheckToken(sc,0x7c);
    } while ((bVar1) || (bVar1 = FScanner::CheckToken(sc,0x2c), bVar1));
  }
  SBarInfoCommandFlowControl::Parse
            (&this->super_SBarInfoCommandFlowControl,sc,this->fullScreenOffsets);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			this->fullScreenOffsets = fullScreenOffsets;
			if(sc.CheckToken(','))
			{
				while(sc.CheckToken(TK_Identifier))
				{
					if(sc.Compare("forcescaled"))
						forceScaled = true;
					else if(sc.Compare("fullscreenoffsets"))
						this->fullScreenOffsets = true;
					else
						sc.ScriptError("Unkown flag '%s'.", sc.String);
					if(!sc.CheckToken('|') && !sc.CheckToken(','))
					{
						SBarInfoCommandFlowControl::Parse(sc, this->fullScreenOffsets);
						return;
					}
				}
				sc.MustGetToken(TK_FloatConst);
				alpha = sc.Float;
			}
			SBarInfoCommandFlowControl::Parse(sc, this->fullScreenOffsets);
		}